

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleCipher.cpp
# Opt level: O3

uint16_t __thiscall security::SimpleCipher::TagInt(SimpleCipher *this,uint32_t data)

{
  ulong uVar1;
  
  uVar1 = (ulong)this->ExpandedKey[0] * (ulong)(data ^ this->ExpandedKey[1]);
  return (uint16_t)(((uVar1 >> 0x29 | uVar1 * 0x800000) ^ uVar1) >> 0x13);
}

Assistant:

uint16_t SimpleCipher::TagInt(uint32_t data)
{
#ifdef SECURITY_ENABLE_CHECKSUMS
    const uint32_t key = ExpandedKey[0];
    const uint64_t prod = (uint64_t)key * (data ^ ExpandedKey[1]);
    const uint64_t tag64 = prod ^ rot64(prod, 41);
    return (uint16_t)(tag64 >> 19);
#else // SECURITY_ENABLE_CHECKSUMS
    SECURITY_UNUSED(data);
    return 0;
#endif // SECURITY_ENABLE_CHECKSUMS
}